

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint8_linear_scaled_ARGB(float *decodep,int width_times_channels,void *inputp)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint5 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float *pfVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i zero;
  __m128 of3;
  __m128 of2;
  __m128 of1;
  __m128 of0;
  __m128i o3;
  __m128i o2;
  __m128i o1;
  __m128i o0;
  __m128i i;
  uchar *end_input_m16;
  uchar *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  byte local_f8;
  byte bStack_f7;
  byte bStack_f6;
  byte bStack_f5;
  byte bStack_f4;
  byte bStack_f3;
  byte bStack_f2;
  byte bStack_f1;
  byte bStack_d0;
  undefined1 uStack_cf;
  byte bStack_ce;
  byte bStack_cd;
  byte bStack_cc;
  undefined1 uStack_cb;
  byte bStack_ca;
  byte bStack_c9;
  int local_c8;
  uint uStack_c4;
  uint uStack_bc;
  int local_b8;
  uint uStack_b4;
  uint uStack_ac;
  uint uStack_a4;
  uint uStack_9c;
  uint uStack_94;
  uint uStack_8c;
  
  pfVar15 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    end_input_m16 = (uchar *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar15; decode_end = decode_end + 4) {
      decode_end[-4] = (float)end_input_m16[1] * 0.003921569;
      decode_end[-3] = (float)end_input_m16[2] * 0.003921569;
      decode_end[-2] = (float)end_input_m16[3] * 0.003921569;
      decode_end[-1] = (float)*end_input_m16 * 0.003921569;
      end_input_m16 = end_input_m16 + 4;
    }
  }
  else {
    end_input_m16 = (uchar *)inputp;
    decode_end = decodep;
    do {
      do {
        uVar2 = *(undefined8 *)end_input_m16;
        uVar4 = *(undefined8 *)(end_input_m16 + 8);
        local_f8 = (byte)uVar2;
        bStack_f7 = (byte)((ulong)uVar2 >> 8);
        bStack_f6 = (byte)((ulong)uVar2 >> 0x10);
        bStack_f5 = (byte)((ulong)uVar2 >> 0x18);
        bStack_f4 = (byte)((ulong)uVar2 >> 0x20);
        bStack_f3 = (byte)((ulong)uVar2 >> 0x28);
        bStack_f2 = (byte)((ulong)uVar2 >> 0x30);
        bStack_f1 = (byte)((ulong)uVar2 >> 0x38);
        bStack_d0 = (byte)uVar4;
        uStack_cf = (undefined1)((ulong)uVar4 >> 8);
        bStack_ce = (byte)((ulong)uVar4 >> 0x10);
        bStack_cd = (byte)((ulong)uVar4 >> 0x18);
        bStack_cc = (byte)((ulong)uVar4 >> 0x20);
        uStack_cb = (undefined1)((ulong)uVar4 >> 0x28);
        bStack_ca = (byte)((ulong)uVar4 >> 0x30);
        bStack_c9 = (byte)((ulong)uVar4 >> 0x38);
        uStack_94 = (uint)bStack_f7;
        uStack_8c = (uint)bStack_f5;
        uStack_a4 = (uint)bStack_f3;
        uStack_9c = (uint)bStack_f1;
        uVar10 = CONCAT14(uStack_cf,(uint)CONCAT12(uStack_cf,(ushort)bStack_d0)) & 0xff0000ffff;
        local_b8 = (int)uVar10;
        uStack_b4 = (uint)(byte)(uVar10 >> 0x20);
        uStack_ac = (uint)bStack_cd;
        uVar10 = CONCAT14(uStack_cb,(uint)CONCAT12(uStack_cb,(ushort)bStack_cc)) & 0xff0000ffff;
        local_c8 = (int)uVar10;
        uStack_c4 = (uint)(byte)(uVar10 >> 0x20);
        uStack_bc = (uint)bStack_c9;
        fVar7 = (float)uStack_94 * 0.003921569;
        fVar8 = (float)bStack_f6 * 0.003921569;
        fVar9 = (float)uStack_8c * 0.003921569;
        uVar2 = CONCAT17((char)((uint)fVar7 >> 0x18),
                         CONCAT16((char)((uint)fVar7 >> 0x10),
                                  CONCAT15((char)((uint)fVar7 >> 8),
                                           CONCAT14(SUB41(fVar7,0),(float)local_f8 * 0.003921569))))
        ;
        auVar1[8] = SUB41(fVar8,0);
        auVar1._0_8_ = uVar2;
        auVar1[9] = (char)((uint)fVar8 >> 8);
        auVar1[10] = (char)((uint)fVar8 >> 0x10);
        auVar1[0xb] = (char)((uint)fVar8 >> 0x18);
        auVar1[0xc] = SUB41(fVar9,0);
        auVar1[0xd] = (char)((uint)fVar9 >> 8);
        auVar1[0xe] = (char)((uint)fVar9 >> 0x10);
        auVar1[0xf] = (char)((uint)fVar9 >> 0x18);
        fVar7 = (float)uStack_a4 * 0.003921569;
        fVar8 = (float)bStack_f2 * 0.003921569;
        fVar9 = (float)uStack_9c * 0.003921569;
        uVar4 = CONCAT17((char)((uint)fVar7 >> 0x18),
                         CONCAT16((char)((uint)fVar7 >> 0x10),
                                  CONCAT15((char)((uint)fVar7 >> 8),
                                           CONCAT14(SUB41(fVar7,0),(float)bStack_f4 * 0.003921569)))
                        );
        auVar3[8] = SUB41(fVar8,0);
        auVar3._0_8_ = uVar4;
        auVar3[9] = (char)((uint)fVar8 >> 8);
        auVar3[10] = (char)((uint)fVar8 >> 0x10);
        auVar3[0xb] = (char)((uint)fVar8 >> 0x18);
        auVar3[0xc] = SUB41(fVar9,0);
        auVar3[0xd] = (char)((uint)fVar9 >> 8);
        auVar3[0xe] = (char)((uint)fVar9 >> 0x10);
        auVar3[0xf] = (char)((uint)fVar9 >> 0x18);
        fVar7 = (float)uStack_b4 * 0.003921569;
        fVar8 = (float)bStack_ce * 0.003921569;
        fVar9 = (float)uStack_ac * 0.003921569;
        uVar6 = CONCAT17((char)((uint)fVar7 >> 0x18),
                         CONCAT16((char)((uint)fVar7 >> 0x10),
                                  CONCAT15((char)((uint)fVar7 >> 8),
                                           CONCAT14(SUB41(fVar7,0),(float)local_b8 * 0.003921569))))
        ;
        auVar5[8] = SUB41(fVar8,0);
        auVar5._0_8_ = uVar6;
        auVar5[9] = (char)((uint)fVar8 >> 8);
        auVar5[10] = (char)((uint)fVar8 >> 0x10);
        auVar5[0xb] = (char)((uint)fVar8 >> 0x18);
        auVar5[0xc] = SUB41(fVar9,0);
        auVar5[0xd] = (char)((uint)fVar9 >> 8);
        auVar5[0xe] = (char)((uint)fVar9 >> 0x10);
        auVar5[0xf] = (char)((uint)fVar9 >> 0x18);
        zero[1] = CONCAT44((float)uStack_c4 * 0.003921569,(float)local_c8 * 0.003921569);
        of0._0_8_ = auVar1._8_8_;
        auVar14._8_4_ = of0[0];
        auVar14._12_4_ = of0[1];
        auVar14._0_8_ = uVar2;
        auVar17._0_12_ = auVar14._4_12_;
        auVar17._12_4_ = (float)local_f8 * 0.003921569;
        local_198 = auVar14._4_8_;
        uStack_190 = auVar17._8_8_;
        of1._0_8_ = auVar3._8_8_;
        auVar13._8_4_ = of1[0];
        auVar13._12_4_ = of1[1];
        auVar13._0_8_ = uVar4;
        auVar18._0_12_ = auVar13._4_12_;
        auVar18._12_4_ = (float)bStack_f4 * 0.003921569;
        local_1a8 = auVar13._4_8_;
        uStack_1a0 = auVar18._8_8_;
        of2._0_8_ = auVar5._8_8_;
        auVar12._8_4_ = of2[0];
        auVar12._12_4_ = of2[1];
        auVar12._0_8_ = uVar6;
        auVar19._0_12_ = auVar12._4_12_;
        auVar19._12_4_ = (float)local_b8 * 0.003921569;
        local_1b8 = auVar12._4_8_;
        uStack_1b0 = auVar19._8_8_;
        auVar11._8_4_ = (float)bStack_ca * 0.003921569;
        auVar11._12_4_ = (float)uStack_bc * 0.003921569;
        auVar11._0_8_ = zero[1];
        auVar20._0_12_ = auVar11._4_12_;
        auVar20._12_4_ = (float)local_c8 * 0.003921569;
        local_1c8 = auVar11._4_8_;
        uStack_1c0 = auVar20._8_8_;
        *(undefined8 *)decode_end = local_198;
        *(undefined8 *)(decode_end + 2) = uStack_190;
        *(undefined8 *)(decode_end + 4) = local_1a8;
        *(undefined8 *)(decode_end + 6) = uStack_1a0;
        *(undefined8 *)(decode_end + 8) = local_1b8;
        *(undefined8 *)(decode_end + 10) = uStack_1b0;
        *(undefined8 *)(decode_end + 0xc) = local_1c8;
        *(undefined8 *)(decode_end + 0xe) = uStack_1c0;
        decode_end = decode_end + 0x10;
        end_input_m16 = end_input_m16 + 0x10;
      } while (decode_end <= pfVar15 + -0x10);
      bVar16 = decode_end != pfVar15;
      end_input_m16 = (uchar *)((long)inputp + (long)width_times_channels + -0x10);
      decode_end = pfVar15 + -0x10;
    } while (bVar16);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__decode_uint8_linear_scaled )( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__simdf8_mult( of0, of0, STBIR_max_uint8_as_float_inverted8);
      stbir__simdf8_mult( of1, of1, STBIR_max_uint8_as_float_inverted8);
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of2, of2, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of3, of3, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint8_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}